

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementsTable.cpp
# Opt level: O2

void __thiscall OpenMD::ElementsTable::Init(ElementsTable *this)

{
  bool bVar1;
  uint uVar2;
  ifstrstream *this_00;
  long *plVar3;
  int __fd;
  _Alloc_hider _Var4;
  char *pcVar5;
  string filename_;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8068;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8048;
  char charBuffer [32768];
  
  if (this->init_ == false) {
    this->init_ = true;
    getenv("FORCE_PARAM_PATH");
    std::__cxx11::string::assign((char *)&this->dir_);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&filename_,"element.txt",(allocator<char> *)&local_8048);
    this_00 = (ifstrstream *)operator_new(0x278);
    ifstrstream::ifstrstream(this_00);
    _Var4 = filename_._M_dataplus;
    ifstrstream::open(this_00,filename_._M_dataplus._M_p,8,0);
    __fd = (int)_Var4._M_p;
    bVar1 = ifstrstream::is_open(this_00);
    if (!bVar1) {
      std::operator+(&local_8068,&this->dir_,"/");
      std::operator+(&local_8048,&local_8068,&filename_);
      std::__cxx11::string::operator=((string *)&filename_,(string *)&local_8048);
      std::__cxx11::string::~string((string *)&local_8048);
      std::__cxx11::string::~string((string *)&local_8068);
      _Var4 = filename_._M_dataplus;
      ifstrstream::open(this_00,filename_._M_dataplus._M_p,8,0);
      __fd = (int)_Var4._M_p;
      bVar1 = ifstrstream::is_open(this_00);
      if (!bVar1) {
        __fd = 2000;
        snprintf(painCave.errMsg,2000,
                 "Error opening the ElementsTable file:\n\t%s\n\tHave you tried setting the FORCE_PARAM_PATH environment variable?\n"
                 ,filename_._M_dataplus._M_p);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
    }
    bVar1 = ifstrstream::is_open(this_00);
    if (bVar1) {
      while( true ) {
        pcVar5 = charBuffer;
        plVar3 = (long *)std::istream::getline((char *)this_00,(long)charBuffer);
        __fd = (int)pcVar5;
        if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) break;
        ParseLine(this,charBuffer);
      }
    }
    bVar1 = ifstrstream::is_open(this_00);
    if (bVar1) {
      ifstrstream::close(this_00,__fd);
    }
    uVar2 = GetNumberOfElements(this);
    if (uVar2 == 0) {
      snprintf(painCave.errMsg,2000,"ElementsTable error.\n\tCannot initialize database %s \n",
               filename_._M_dataplus._M_p);
      painCave._2000_8_ = painCave._2000_8_ & 0xffffffff00000000;
      simError();
    }
    std::__cxx11::string::~string((string *)&filename_);
  }
  return;
}

Assistant:

void ElementsTable::Init() {
    if (init_) return;
    init_ = true;

    char* tempPath;
    char charBuffer[BUFF_SIZE];
    tempPath = getenv("FORCE_PARAM_PATH");

    if (tempPath == NULL) {
      // convert a macro from compiler to a string in c++
      STR_DEFINE(dir_, FRC_PATH);
    } else {
      dir_ = tempPath;
    }

    std::string filename_("element.txt");

    ifstrstream* efStream = new ifstrstream();

    // Try to open the elements file in current directory first
    efStream->open(filename_.c_str());

    if (!efStream->is_open()) {
      // If current directory does not contain the elements file,
      // try to open it in ffPath_:
      filename_ = dir_ + FILE_SEP_CHAR + filename_;
      efStream->open(filename_.c_str());

      if (!efStream->is_open()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Error opening the ElementsTable file:\n"
                 "\t%s\n"
                 "\tHave you tried setting the FORCE_PARAM_PATH environment "
                 "variable?\n",
                 filename_.c_str());
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }
    }

    if (efStream->is_open()) {
      while (efStream->getline(charBuffer, BUFF_SIZE))
        ParseLine(charBuffer);
    }

    if (efStream->is_open()) efStream->close();

    if (GetSize() == 0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ElementsTable error.\n"
               "\tCannot initialize database %s \n",
               filename_.c_str());
      painCave.isFatal = 0;
      simError();
    }
  }